

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_authorization.c
# Opt level: O0

IOTHUB_AUTHORIZATION_HANDLE IoTHubClient_Auth_CreateFromDeviceAuth(char *device_id,char *module_id)

{
  DEVICE_AUTH_TYPE DVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_SECURITY_HANDLE pIVar3;
  DEVICE_AUTH_TYPE auth_type;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  IOTHUB_AUTHORIZATION_DATA *result;
  char *module_id_local;
  char *device_id_local;
  
  if (device_id == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                ,"IoTHubClient_Auth_CreateFromDeviceAuth",0xa8,1,"Invalid Parameter device_id: %p",0
               );
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)initialize_auth_client(device_id,module_id);
    if ((IOTHUB_AUTHORIZATION_DATA *)l == (IOTHUB_AUTHORIZATION_DATA *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                  ,"IoTHubClient_Auth_CreateFromDeviceAuth",0xb1,1,
                  "Failure initializing auth client");
      }
    }
    else {
      pIVar3 = iothub_device_auth_create();
      ((IOTHUB_AUTHORIZATION_DATA *)l)->device_auth_handle = pIVar3;
      if (((IOTHUB_AUTHORIZATION_DATA *)l)->device_auth_handle == (IOTHUB_SECURITY_HANDLE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_authorization.c"
                    ,"IoTHubClient_Auth_CreateFromDeviceAuth",0xb8,1,
                    "Failed allocating IOTHUB_AUTHORIZATION_DATA");
        }
        free(((IOTHUB_AUTHORIZATION_DATA *)l)->device_id);
        free(((IOTHUB_AUTHORIZATION_DATA *)l)->module_id);
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        DVar1 = iothub_device_auth_get_type(((IOTHUB_AUTHORIZATION_DATA *)l)->device_auth_handle);
        if ((DVar1 == AUTH_TYPE_SAS) || (DVar1 == AUTH_TYPE_SYMM_KEY)) {
          ((IOTHUB_AUTHORIZATION_DATA *)l)->cred_type = IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH;
        }
        else {
          ((IOTHUB_AUTHORIZATION_DATA *)l)->cred_type = IOTHUB_CREDENTIAL_TYPE_X509_ECC;
        }
      }
    }
  }
  return (IOTHUB_AUTHORIZATION_HANDLE)l;
}

Assistant:

IOTHUB_AUTHORIZATION_HANDLE IoTHubClient_Auth_CreateFromDeviceAuth(const char* device_id, const char* module_id)
{
    IOTHUB_AUTHORIZATION_DATA* result;
    if (device_id == NULL)
    {
        LogError("Invalid Parameter device_id: %p", device_id);
        result = NULL;
    }
    else
    {
#ifdef USE_PROV_MODULE
        result = initialize_auth_client(device_id, module_id);
        if (result == NULL)
        {
            LogError("Failure initializing auth client");
        }
        else
        {
            result->device_auth_handle = iothub_device_auth_create();
            if (result->device_auth_handle == NULL)
            {
                LogError("Failed allocating IOTHUB_AUTHORIZATION_DATA");
                free(result->device_id);
                free(result->module_id);
                free(result);
                result = NULL;
            }
            else
            {
                DEVICE_AUTH_TYPE auth_type = iothub_device_auth_get_type(result->device_auth_handle);
                if (auth_type == AUTH_TYPE_SAS || auth_type == AUTH_TYPE_SYMM_KEY)
                {
                    result->cred_type = IOTHUB_CREDENTIAL_TYPE_DEVICE_AUTH;
                }
                else
                {
                    result->cred_type = IOTHUB_CREDENTIAL_TYPE_X509_ECC;
                }
            }
        }
#else
        (void)module_id;
        LogError("Failed HSM module is not supported");
        result = NULL;
#endif
    }
    return result;
}